

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_reducedb(sat_solver *s)

{
  uint nSize;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cla cVar5;
  abctime aVar6;
  Sat_Mem_t *p;
  int *piVar7;
  int *pCosts;
  int *piVar8;
  clause *pcVar9;
  abctime aVar10;
  bool bVar11;
  clause *local_70;
  clause *c;
  int nSelected;
  int CounterStart;
  int Counter;
  int Id;
  int j;
  int k;
  int i;
  int nCutoffValue;
  int *pSortValues;
  int *pArray;
  int *pPerm;
  int *act_clas;
  int nLearnedOld;
  Sat_Mem_t *pMem;
  abctime clk;
  sat_solver *s_local;
  
  aVar6 = Abc_Clock();
  p = &s->Mem;
  nSize = veci_size(&s->act_clas);
  piVar7 = veci_begin(&s->act_clas);
  if (s->nLearntMax < 1) {
    __assert_fail("s->nLearntMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x5fc,"void sat_solver_reducedb(sat_solver *)");
  }
  uVar1 = Sat_MemEntryNum(p,1);
  if (nSize != uVar1) {
    __assert_fail("nLearnedOld == Sat_MemEntryNum(pMem, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x5fd,"void sat_solver_reducedb(sat_solver *)");
  }
  if (nSize != (s->stats).learnts) {
    __assert_fail("nLearnedOld == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x5fe,"void sat_solver_reducedb(sat_solver *)");
  }
  s->nDBreduces = s->nDBreduces + 1;
  s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
  pCosts = (int *)malloc((long)(int)nSize << 2);
  for (j = 1; j <= (s->Mem).iPage[1]; j = j + 2) {
    Id = 2;
    while( true ) {
      iVar2 = Sat_MemLimit((s->Mem).pPages[j]);
      bVar11 = false;
      if (Id < iVar2) {
        local_70 = Sat_MemClause(p,j,Id);
        bVar11 = local_70 != (clause *)0x0;
      }
      if (!bVar11) break;
      iVar2 = clause_id(local_70);
      if (s->ClaActType == 0) {
        iVar3 = Abc_MinInt((uint)*local_70 >> 3 & 0xff,7);
        pCosts[iVar2] = (7 - iVar3) * 0x10000000 | piVar7[iVar2] >> 4;
      }
      else {
        iVar3 = Abc_MinInt((uint)*local_70 >> 3 & 0xff,7);
        pCosts[iVar2] = (7 - iVar3) * 0x10000000;
      }
      if (pCosts[iVar2] < 0) {
        __assert_fail("pSortValues[Id] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x610,"void sat_solver_reducedb(sat_solver *)");
      }
      iVar2 = Sat_MemClauseSize(local_70);
      Id = iVar2 + Id;
    }
  }
  iVar2 = s->nLearntMax;
  iVar3 = s->nLearntRatio;
  piVar8 = Abc_MergeSortCost(pCosts,nSize);
  if (pCosts[piVar8[(int)(nSize - 1)]] < pCosts[*piVar8]) {
    __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x61b,"void sat_solver_reducedb(sat_solver *)");
  }
  iVar3 = pCosts[piVar8[(int)(nSize - (int)(nSize * iVar3) / 100)]];
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  Counter = 0;
  nSelected = 0;
  j = 1;
  do {
    if ((s->Mem).iPage[1] < j) {
      if ((s->stats).learnts != Counter) {
        __assert_fail("s->stats.learnts == (unsigned)j",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x62e,"void sat_solver_reducedb(sat_solver *)");
      }
      if (nSelected != nSize) {
        __assert_fail("Counter == nLearnedOld",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x62f,"void sat_solver_reducedb(sat_solver *)");
      }
      veci_resize(&s->act_clas,Counter);
      if (pCosts != (int *)0x0) {
        free(pCosts);
      }
      uVar1 = Sat_MemCompactLearned(p,0);
      if (uVar1 != (s->stats).learnts) {
        __assert_fail("Counter == (int)s->stats.learnts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x635,"void sat_solver_reducedb(sat_solver *)");
      }
      for (j = 0; j < s->size; j = j + 1) {
        if (((s->reasons[j] != 0) && (iVar2 = clause_is_lit(s->reasons[j]), iVar2 == 0)) &&
           (iVar2 = clause_learnt_h(p,s->reasons[j]), iVar2 != 0)) {
          pcVar9 = clause_read(s,s->reasons[j]);
          if (((uint)*pcVar9 >> 1 & 1) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x641,"void sat_solver_reducedb(sat_solver *)");
          }
          iVar2 = clause_id(pcVar9);
          s->reasons[j] = iVar2;
        }
      }
      for (j = 0; SBORROW4(j,s->size * 2) != j + s->size * -2 < 0; j = j + 1) {
        piVar7 = veci_begin(s->wlists + j);
        Counter = 0;
        for (Id = 0; iVar2 = veci_size(s->wlists + j), Id < iVar2; Id = Id + 1) {
          iVar2 = clause_is_lit(piVar7[Id]);
          if (iVar2 == 0) {
            iVar2 = clause_learnt_h(p,piVar7[Id]);
            if (iVar2 == 0) {
              piVar7[Counter] = piVar7[Id];
              Counter = Counter + 1;
            }
            else {
              pcVar9 = clause_read(s,piVar7[Id]);
              if (((uint)*pcVar9 >> 1 & 1) == 0) {
                iVar2 = clause_id(pcVar9);
                piVar7[Counter] = iVar2;
                Counter = Counter + 1;
              }
            }
          }
          else {
            piVar7[Counter] = piVar7[Id];
            Counter = Counter + 1;
          }
        }
        veci_resize(s->wlists + j,Counter);
      }
      uVar1 = Sat_MemCompactLearned(p,1);
      if (uVar1 != (s->stats).learnts) {
        __assert_fail("Counter == (int)s->stats.learnts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x65b,"void sat_solver_reducedb(sat_solver *)");
      }
      aVar10 = Abc_Clock();
      sat_solver_reducedb::TimeTotal = (aVar10 - aVar6) + sat_solver_reducedb::TimeTotal;
      if (s->fVerbose != 0) {
        uVar1 = (s->stats).learnts;
        Abc_Print(1,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
                  ((double)uVar1 * 100.0) / (double)(int)nSize,(ulong)uVar1,(ulong)nSize);
        Abc_PrintTime(1,"Time",sat_solver_reducedb::TimeTotal);
      }
      return;
    }
    Id = 2;
    while( true ) {
      iVar4 = Sat_MemLimit((s->Mem).pPages[j]);
      bVar11 = false;
      if (Id < iVar4) {
        local_70 = Sat_MemClause(p,j,Id);
        bVar11 = local_70 != (clause *)0x0;
      }
      if (!bVar11) break;
      if (((uint)*local_70 >> 1 & 1) != 0) {
        __assert_fail("c->mark == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x624,"void sat_solver_reducedb(sat_solver *)");
      }
      if ((((int)(nSize - iVar2 / 0x14) < nSelected) || (iVar4 = clause_size(local_70), iVar4 < 3))
         || (iVar4 = clause_id(local_70), iVar3 < pCosts[iVar4])) {
LAB_0068c381:
        iVar4 = clause_id(local_70);
        piVar7[Counter] = piVar7[iVar4];
        Counter = Counter + 1;
      }
      else {
        piVar8 = s->reasons;
        iVar4 = lit_var((lit)local_70[1]);
        iVar4 = piVar8[iVar4];
        cVar5 = Sat_MemHand(p,j,Id);
        if (iVar4 == cVar5) goto LAB_0068c381;
        *local_70 = (clause)((uint)*local_70 & 0xfffffffd | 2);
        iVar4 = clause_size(local_70);
        (s->stats).learnts_literals = (s->stats).learnts_literals - (long)iVar4;
        (s->stats).learnts = (s->stats).learnts - 1;
      }
      iVar4 = Sat_MemClauseSize(local_70);
      Id = iVar4 + Id;
      nSelected = nSelected + 1;
    }
    j = j + 2;
  } while( true );
}

Assistant:

void sat_solver_reducedb(sat_solver* s)
{
    static abctime TimeTotal = 0;
    abctime clk = Abc_Clock();
    Sat_Mem_t * pMem = &s->Mem;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pArray, * pSortValues, nCutoffValue;
    int i, k, j, Id, Counter, CounterStart, nSelected;
    clause * c;

    assert( s->nLearntMax > 0 );
    assert( nLearnedOld == Sat_MemEntryNum(pMem, 1) );
    assert( nLearnedOld == (int)s->stats.learnts );

    s->nDBreduces++;

    //printf( "Calling reduceDB with %d learned clause limit.\n", s->nLearntMax );
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
//    return;

    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
//        pSortValues[Id] = act[Id];
        if ( s->ClaActType == 0 )
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4);
        else
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28);// | (act_clas[Id] >> 4);
        assert( pSortValues[Id] >= 0 );
    }

    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);

    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;

    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    ActCutOff = ABC_INFINITY;

    // mark learned clauses to remove
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 3 || pSortValues[clause_id(c)] > nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
            act_clas[j++] = act_clas[clause_id(c)];
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    ABC_FREE( pSortValues );

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        c = clause_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                c = clause_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
    Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
        s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
    Abc_PrintTime( 1, "Time", TimeTotal );
    }
}